

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_loadDict(LZ4_stream_t *LZ4_dict,char *dictionary,int dictSize)

{
  uint32_t uVar1;
  uint32_t uVar2;
  char *pcVar3;
  long *plVar4;
  U32 *hashTable;
  int iVar5;
  
  if (((LZ4_dict->internal_donotuse).initCheck != 0) ||
     (0x40000000 < (LZ4_dict->internal_donotuse).currentOffset)) {
    memset(LZ4_dict,0,0x4020);
  }
  if (dictSize < 8) {
    LZ4_dict->table[0x801] = 0;
    (LZ4_dict->internal_donotuse).dictSize = 0;
    uVar2 = 0;
  }
  else {
    pcVar3 = dictionary + dictSize;
    plVar4 = (long *)(pcVar3 + -0x10000);
    if (dictSize < 0x10001) {
      plVar4 = (long *)dictionary;
    }
    uVar1 = (LZ4_dict->internal_donotuse).currentOffset;
    LZ4_dict->table[0x801] = (unsigned_long_long)plVar4;
    uVar2 = (int)pcVar3 - (int)plVar4;
    (LZ4_dict->internal_donotuse).dictSize = uVar2;
    (LZ4_dict->internal_donotuse).currentOffset = uVar1 + uVar2 + 0x10000;
    if (plVar4 <= pcVar3 + -8) {
      iVar5 = uVar1 + 0x10000;
      do {
        *(int *)((long)LZ4_dict + ((ulong)(*plVar4 * -0x30e4432345000000) >> 0x34) * 4) = iVar5;
        plVar4 = (long *)((long)plVar4 + 3);
        iVar5 = iVar5 + 3;
      } while (plVar4 <= pcVar3 + -8);
    }
  }
  return uVar2;
}

Assistant:

int LZ4_loadDict (LZ4_stream_t* LZ4_dict, const char* dictionary, int dictSize)
{
    LZ4_stream_t_internal* dict = &LZ4_dict->internal_donotuse;
    const BYTE* p = (const BYTE*)dictionary;
    const BYTE* const dictEnd = p + dictSize;
    const BYTE* base;

    if ((dict->initCheck) || (dict->currentOffset > 1 GB))  /* Uninitialized structure, or reuse overflow */
        LZ4_resetStream(LZ4_dict);

    if (dictSize < (int)HASH_UNIT) {
        dict->dictionary = NULL;
        dict->dictSize = 0;
        return 0;
    }

    if ((dictEnd - p) > 64 KB) p = dictEnd - 64 KB;
    dict->currentOffset += 64 KB;
    base = p - dict->currentOffset;
    dict->dictionary = p;
    dict->dictSize = (U32)(dictEnd - p);
    dict->currentOffset += dict->dictSize;

    while (p <= dictEnd-HASH_UNIT) {
        LZ4_putPosition(p, dict->hashTable, byU32, base);
        p+=3;
    }

    return dict->dictSize;
}